

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAAdataStore(IDAMem IDA_mem,IDAckpntMem ck_mem)

{
  double *pdVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 *in_RSI;
  long in_RDI;
  int sign;
  int flag;
  long i;
  sunrealtype t;
  IDAdtpntMem *dt_mem;
  IDAadjMem IDAADJ_mem;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  IDAMem in_stack_ffffffffffffffc8;
  double dVar5;
  double local_30;
  int local_4;
  
  pdVar1 = *(double **)(in_RDI + 0x840);
  puVar2 = (undefined8 *)pdVar1[0xf];
  iVar3 = IDAAckpntGet(in_stack_ffffffffffffffc8,
                       (IDAckpntMem)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar3 == 0) {
    *(undefined8 *)*puVar2 = *in_RSI;
    (*(code *)pdVar1[0x12])(in_RDI,*puVar2);
    if (*(int *)((long)pdVar1 + 0x14) != 0) {
      IDASetStopTime(in_stack_ffffffffffffffc8,
                     (sunrealtype)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    }
    iVar3 = -1;
    if (0.0 < pdVar1[1] - *pdVar1) {
      iVar3 = 1;
    }
    dVar5 = 4.94065645841247e-324;
    do {
      iVar4 = IDASolve(IDA_mem,(sunrealtype)ck_mem,&IDAADJ_mem->ia_tinitial,(N_Vector)dt_mem,
                       (N_Vector)t,i._4_4_);
      if (iVar4 < 0) {
        return -0x6a;
      }
      *(double *)puVar2[(long)dVar5] = local_30;
      (*(code *)pdVar1[0x12])(in_RDI,puVar2[(long)dVar5]);
      dVar5 = (double)((long)dVar5 + 1);
    } while (0.0 < (double)iVar3 * ((double)in_RSI[1] - local_30));
    pdVar1[0xb] = (double)in_RSI;
    *(undefined4 *)((long)pdVar1 + 0xb4) = 1;
    pdVar1[0x10] = dVar5;
    local_4 = 0;
  }
  else {
    local_4 = -0x69;
  }
  return local_4;
}

Assistant:

static int IDAAdataStore(IDAMem IDA_mem, IDAckpntMem ck_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  sunrealtype t;
  long int i;
  int flag, sign;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Initialize IDA_mem with data from ck_mem. */
  flag = IDAAckpntGet(IDA_mem, ck_mem);
  if (flag != IDA_SUCCESS) { return (IDA_REIFWD_FAIL); }

  /* Set first structure in dt_mem[0] */
  dt_mem[0]->t = ck_mem->ck_t0;
  IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);

  /* Decide whether TSTOP must be activated */
  if (IDAADJ_mem->ia_tstopIDAFcall)
  {
    IDASetStopTime(IDA_mem, IDAADJ_mem->ia_tstopIDAF);
  }

  sign = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Run IDASolve in IDA_ONE_STEP mode to set following structures in dt_mem[i]. */
  i = 1;
  do {
    flag = IDASolve(IDA_mem, ck_mem->ck_t1, &t, IDAADJ_mem->ia_yyTmp,
                    IDAADJ_mem->ia_ypTmp, IDA_ONE_STEP);
    if (flag < 0) { return (IDA_FWD_FAIL); }

    dt_mem[i]->t = t;
    IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[i]);

    i++;
  }
  while (sign * (ck_mem->ck_t1 - t) > ZERO);

  /* New data is now available. */
  IDAADJ_mem->ia_ckpntData = ck_mem;
  IDAADJ_mem->ia_newData   = SUNTRUE;
  IDAADJ_mem->ia_np        = i;

  return (IDA_SUCCESS);
}